

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
          *this,EnumDescriptor *descriptor)

{
  int iVar1;
  EnumValueDescriptor *descriptor_00;
  undefined4 local_1c;
  int i;
  EnumDescriptor *descriptor_local;
  VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
  *this_local;
  
  ::const::$_0::operator()((__0 *)this,descriptor);
  local_1c = 0;
  while( true ) {
    iVar1 = EnumDescriptor::value_count(descriptor);
    if (iVar1 <= local_1c) break;
    descriptor_00 = EnumDescriptor::value(descriptor,local_1c);
    Visit<>(this,descriptor_00);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }